

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O2

void __thiscall Test_aistr_append_Test::TestBody(Test_aistr_append_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_40;
  AssertHelper local_38;
  AssertionResult gtest_ar;
  char buf [10];
  
  buf[8] = '\0';
  buf[9] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::append<10ul>(&buf,(char *)0x0);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x6b,
             "Expected: ai::append(buf, nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  ai::append<10ul>(&buf,"1234");
  local_40.data_._0_4_ = ai::compare<10ul>(&buf,"1234");
  local_38.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"ai::compare(buf, \"1234\")","0",(int *)&local_40,
             (int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pcVar2 = "";
    ai::append<10ul>(&buf,"");
    local_40.data_._0_4_ = ai::compare<10ul>(&buf,"1234");
    local_38.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"ai::compare(buf, \"1234\")","0",(int *)&local_40,
               (int *)&local_38);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x71,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      ai::append<10ul>(&buf,"5678");
      local_40.data_._0_4_ = ai::compare<10ul>(&buf,"12345678");
      local_38.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"ai::compare(buf, \"12345678\")","0",(int *)&local_40,
                 (int *)&local_38);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_40);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x74,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        ai::append<10ul>(&buf,"9");
        local_40.data_._0_4_ = ai::compare<10ul>(&buf,"123456789");
        local_38.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"ai::compare(buf, \"123456789\")","0",(int *)&local_40,
                   (int *)&local_38);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          ai::append<10ul>(&buf,"01");
          local_40.data_._0_4_ = ai::compare<10ul>(&buf,"123456789");
          local_38.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"ai::compare(buf, \"123456789\")","0",(int *)&local_40,
                     (int *)&local_38);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_40);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x7a,pcVar2);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_40);
          }
          goto LAB_0010e520;
        }
        testing::Message::Message((Message *)&local_40);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x77,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_40);
LAB_0010e520:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(Test_aistr, append) {
    char buf[10] = {0};

    EXPECT_THROW(ai::append(buf, nullptr), std::invalid_argument);

    ai::append(buf, "1234");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);

    ai::append(buf, "");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);

    ai::append(buf, "5678");
    ASSERT_EQ(ai::compare(buf, "12345678"), 0);

    ai::append(buf, "9");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);

    ai::append(buf, "01");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);
}